

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O3

void __thiscall
halfFunction<half>::halfFunction<half(*)(half)>
          (halfFunction<half> *this,_func_half_half *f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  float fVar1;
  half hVar2;
  half *phVar3;
  int i;
  ulong uVar4;
  
  phVar3 = (half *)operator_new__(0x20000);
  this->_lut = phVar3;
  uVar4 = 0;
  do {
    if ((uVar4 & 0x3ff) == 0 || (~(uint)uVar4 & 0x7c00) != 0) {
      if (((uint)uVar4 & 0x7fff) == 0x7c00) {
        hVar2._h = posInfValue._h;
        if ((short)(unsigned_short)uVar4 < 0) {
          hVar2._h = negInfValue._h;
        }
      }
      else {
        fVar1 = half::_toFloat[uVar4].f;
        hVar2._h = defaultValue._h;
        if ((half::_toFloat[domainMin._h].f <= fVar1) &&
           (fVar1 < half::_toFloat[domainMax._h].f || fVar1 == half::_toFloat[domainMax._h].f)) {
          hVar2 = (*f)((unsigned_short)uVar4);
          phVar3 = this->_lut;
          phVar3[uVar4]._h = hVar2._h;
          goto LAB_0016bbfe;
        }
      }
      phVar3[uVar4]._h = hVar2._h;
    }
    else {
      phVar3[uVar4]._h = nanValue._h;
    }
LAB_0016bbfe:
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x10000) {
      return;
    }
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (Function f,
			       half domainMin,
			       half domainMax,
			       T defaultValue,
			       T posInfValue,
			       T negInfValue,
			       T nanValue)
{
#ifndef ILMBASE_HAVE_LARGE_STACK
    _lut = new T[1<<16];
#endif
    
    for (int i = 0; i < (1 << 16); i++)
    {
	half x;
	x.setBits (i);

	if (x.isNan())
	    _lut[i] = nanValue;
	else if (x.isInfinity())
	    _lut[i] = x.isNegative()? negInfValue: posInfValue;
	else if (x < domainMin || x > domainMax)
	    _lut[i] = defaultValue;
	else
	    _lut[i] = f (x);
    }
}